

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

void __thiscall
pbrt::LightPathIntegrator::EvaluatePixelSample
          (LightPathIntegrator *this,Point2i pPixel,int sampleIndex,SamplerHandle *sampler,
          ScratchBuffer *scratchBuffer)

{
  float fVar1;
  CameraHandle *this_00;
  PrimitiveHandle *this_01;
  float fVar2;
  PowerLightSampler *this_02;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  LightSampleContext ctx;
  undefined1 auVar8 [16];
  Normal3f n;
  undefined1 auVar9 [16];
  Vector3f wiRender;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  DebugMLTSampler *pDVar16;
  int iVar17;
  int iVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Float FVar22;
  Point2f u;
  float fVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar30 [64];
  Tuple2<pbrt::Point2,_float> TVar24;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar31 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined1 auVar36 [56];
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar35 [64];
  undefined4 uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [56];
  undefined1 auVar42 [64];
  Point3f p;
  Vector3f wi;
  SampledSpectrum SVar44;
  SampledSpectrum a;
  SampledSpectrum v;
  LightHandle light;
  optional<pbrt::BSDFSample> bs;
  SampledWavelengths lambda;
  optional<pbrt::SampledLight> sampledLight;
  optional<pbrt::LightLeSample> les;
  RayDifferential ray;
  optional<pbrt::CameraWiSample> cs;
  SampledSpectrum Le;
  BSDF bsdf;
  undefined1 local_4d8 [16];
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  LightHandle local_490;
  float local_488;
  float local_484;
  uint local_480;
  uint local_47c;
  aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> local_478;
  byte local_44c;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_440;
  CameraHandle local_438;
  SampledWavelengths local_430;
  aligned_storage_t<sizeof(pbrt::SampledLight),_alignof(pbrt::SampledLight)> local_410;
  char local_400;
  undefined1 local_3f8 [4];
  float afStack_3f4 [13];
  Interaction local_3c0;
  undefined1 local_370;
  undefined4 local_368;
  undefined4 local_364;
  bool local_360;
  Float local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [76];
  undefined1 auStack_2ec [16];
  undefined1 local_2d8 [40];
  Interaction IStack_2b0;
  Interaction IStack_260;
  undefined1 uStack_210;
  undefined1 auStack_20f [55];
  ulong local_1d8;
  undefined1 local_1c8 [4];
  float afStack_1c4 [7];
  Point2f local_1a8;
  Interaction local_1a0;
  Interaction local_150;
  bool local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  RayDifferential local_c8;
  BSDF local_68;
  undefined1 auVar32 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar41 [64];
  
  local_2d8._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar22 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)local_1c8,local_2d8,(ulong)local_2d8._0_8_ >> 0x30);
  SampledWavelengths::SampleXYZ
            (&local_430,
             (Float)((uint)(*(byte *)(Options + 6) & 1) * 0x3f000000 +
                    (uint)!(bool)(*(byte *)(Options + 6) & 1) * (int)FVar22));
  this_02 = (this->lightSampler)._M_t.
            super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>
            ._M_t.
            super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>
            .super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl;
  local_2d8._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar22 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)local_1c8,local_2d8,(ulong)local_2d8._0_8_ >> 0x30);
  PowerLightSampler::Sample((optional<pbrt::SampledLight> *)&local_410.__align,this_02,FVar22);
  if (local_400 != '\x01') {
    return;
  }
  local_490.
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           )(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             )local_410.__align;
  local_2d8._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar22 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)local_1c8,local_2d8,(ulong)local_2d8._0_8_ >> 0x30);
  this_00 = &(this->super_ImageTileIntegrator).camera;
  uVar13 = (this_00->
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           ).bits & 0xffffffffffff;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(FVar22 * *(float *)(uVar13 + 0x33c))),
                            ZEXT416((uint)(1.0 - FVar22)),ZEXT416(*(uint *)(uVar13 + 0x338)));
  uVar13 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  pDVar16 = (DebugMLTSampler *)(uVar13 & 0xffffffffffff);
  sVar7 = (short)(uVar13 >> 0x30);
  if (uVar13 >> 0x30 < 5) {
    if (uVar13 < 0x3000000000000) {
      if (sVar7 == 2) {
        local_4d8._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar16);
      }
      else {
        local_4d8._0_8_ = RandomSampler::Get2D((RandomSampler *)pDVar16);
      }
    }
    else if (sVar7 == 3) {
      local_4d8._0_8_ = HaltonSampler::Get2D((HaltonSampler *)pDVar16);
    }
    else {
      local_4d8._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar16);
    }
  }
  else if (uVar13 < 0x7000000000000) {
    if (sVar7 == 6) {
      local_4d8._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)pDVar16);
    }
    else {
      local_4d8._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar16);
    }
  }
  else if (uVar13 >> 0x30 == 8) {
    local_4d8._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar16);
  }
  else if (sVar7 == 7) {
    local_4d8._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar16);
  }
  else {
    local_4d8._0_4_ = DebugMLTSampler::Get1D(pDVar16);
    local_4d8._4_4_ = extraout_XMM0_Db;
    local_4d8._8_4_ = extraout_XMM0_Dc;
    local_4d8._12_4_ = extraout_XMM0_Dd;
    auVar30._0_4_ = DebugMLTSampler::Get1D(pDVar16);
    auVar30._4_60_ = extraout_var;
    auVar20 = vinsertps_avx(local_4d8,auVar30._0_16_,0x10);
    local_4d8._0_8_ = auVar20._0_8_;
  }
  uVar13 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  pDVar16 = (DebugMLTSampler *)(uVar13 & 0xffffffffffff);
  sVar7 = (short)(uVar13 >> 0x30);
  if (uVar13 < 0x5000000000000) {
    if (uVar13 < 0x3000000000000) {
      if (sVar7 == 2) {
        TVar24 = (Tuple2<pbrt::Point2,_float>)StratifiedSampler::Get2D((StratifiedSampler *)pDVar16)
        ;
      }
      else {
        TVar24 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)pDVar16);
      }
    }
    else if (sVar7 == 3) {
      TVar24 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)pDVar16);
    }
    else {
      TVar24 = (Tuple2<pbrt::Point2,_float>)PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar16)
      ;
    }
  }
  else if (uVar13 < 0x7000000000000) {
    if (sVar7 == 6) {
      TVar24 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)pDVar16);
    }
    else {
      TVar24 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)pDVar16);
    }
  }
  else if (uVar13 >> 0x30 == 8) {
    TVar24 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar16);
  }
  else if (sVar7 == 7) {
    TVar24 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar16);
  }
  else {
    local_4b8._0_4_ = DebugMLTSampler::Get1D(pDVar16);
    local_4b8._4_4_ = extraout_XMM0_Db_00;
    fStack_4b0 = (float)extraout_XMM0_Dc_00;
    fStack_4ac = (float)extraout_XMM0_Dd_00;
    auVar31._0_4_ = DebugMLTSampler::Get1D(pDVar16);
    auVar31._4_60_ = extraout_var_00;
    auVar20 = vinsertps_avx(_local_4b8,auVar31._0_16_,0x10);
    TVar24 = auVar20._0_8_;
  }
  LightHandle::SampleLe
            ((optional<pbrt::LightLeSample> *)local_3f8,&local_490,(Point2f)local_4d8._0_8_,
             (Point2f)TVar24,&local_430,auVar19._0_4_);
  if (local_360 != true) {
    return;
  }
  if (((float)local_368 == 0.0) && (!NAN((float)local_368))) {
    return;
  }
  if (((float)local_364 == 0.0) && (!NAN((float)local_364))) {
    return;
  }
  if (((float)local_3f8 == 0.0) && (!NAN((float)local_3f8))) {
    uVar13 = 0;
    while (uVar14 = uVar13, uVar14 != 3) {
      if ((afStack_3f4[uVar14] != 0.0) || (uVar13 = uVar14 + 1, NAN(afStack_3f4[uVar14]))) break;
    }
    if (2 < uVar14) {
      return;
    }
  }
  if (local_370 != '\x01') goto LAB_003cccc5;
  u = SamplerHandle::Get2D(sampler);
  CameraHandle::SampleWi
            ((optional<pbrt::CameraWiSample> *)local_2d8,this_00,&local_3c0,u,&local_430);
  auVar31 = (undefined1  [64])IStack_260._8_64_;
  auVar30 = stack0xfffffffffffffd68;
  if ((bool)uStack_210 == true) {
    if (((float)local_2d8._28_4_ != 0.0) || (NAN((float)local_2d8._28_4_))) {
      uStack_e8._0_4_ =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           low;
      uStack_e8._4_4_ =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           high;
      IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
           auVar31._0_8_;
      local_f8._0_4_ =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           low;
      local_f8._4_4_ =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           high;
      uStack_f0._0_4_ =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           low;
      uStack_f0._4_4_ =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           high;
      uStack_e0 = 0;
      uStack_d8 = SUB168(ZEXT816(0),4);
      uStack_d0 = 0;
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
           IStack_260.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
      ctx.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      ctx.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(undefined4)uStack_d8;
      ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uStack_d8._4_4_;
      ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      unique0x10001cfe = auVar30;
      IStack_260._8_64_ = auVar31;
      FVar22 = LightHandle::PDF_Li(&local_490,ctx,(Vector3f)local_2d8._16_12_,WithoutMIS);
      if (0.0 < FVar22) {
        if (((local_360 != true) || (local_370 != '\x01')) || ((bool)uStack_210 != true))
        goto LAB_003cd5c3;
        n.super_Tuple3<pbrt::Normal3,_float>.y = local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.y;
        n.super_Tuple3<pbrt::Normal3,_float>.x = local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.x;
        n.super_Tuple3<pbrt::Normal3,_float>.z = local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar19 = vinsertps_avx(ZEXT416((uint)((local_3c0.pi.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
                                               local_3c0.pi.super_Point3<pbrt::Interval>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
                                              0.5)),
                                ZEXT416((uint)((local_3c0.pi.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
                                               local_3c0.pi.super_Point3<pbrt::Interval>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) *
                                              0.5)),0x10);
        p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar19._0_8_;
        p.super_Tuple3<pbrt::Point3,_float>.z =
             (local_3c0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
              .low + local_3c0.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        auVar43 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
        auVar36 = ZEXT856(auVar19._8_8_);
        SVar44 = LightHandle::L(&local_490,p,n,local_3c0.uv,(Vector3f)local_2d8._16_12_,&local_430);
        auVar41._0_8_ = SVar44.values.values._8_8_;
        auVar41._8_56_ = auVar43;
        auVar32._0_8_ = SVar44.values.values._0_8_;
        auVar32._8_56_ = auVar36;
        _local_1c8 = vmovlhps_avx(auVar32._0_16_,auVar41._0_16_);
        if (((float)local_1c8 == 0.0) && (!NAN((float)local_1c8))) {
          uVar13 = 0;
          while (uVar14 = uVar13, uVar14 != 3) {
            if ((*(float *)(local_1c8 + uVar14 * 4 + 4) != 0.0) ||
               (uVar13 = uVar14 + 1, NAN(*(float *)(local_1c8 + uVar14 * 4 + 4)))) break;
          }
          if (2 < uVar14) goto LAB_003cccb3;
        }
        if ((bool)uStack_210 == false) {
LAB_003cd5c3:
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
        }
        bVar12 = Integrator::Unoccluded((Integrator *)this,&IStack_2b0,&IStack_260);
        if (bVar12) {
          if ((local_360 != true) || ((bool)uStack_210 == false)) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
          }
          if (local_370 == '\x01') {
            auVar19 = vfmadd132ss_fma(ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.y
                                             ),ZEXT416((uint)(local_3c0.n.
                                                              super_Tuple3<pbrt::Normal3,_float>.z *
                                                             (float)local_2d8._24_4_)),
                                      ZEXT416((uint)local_2d8._20_4_));
            auVar20 = vfmsub213ss_fma(ZEXT416((uint)local_2d8._24_4_),
                                      ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z
                                             ),ZEXT416((uint)(local_3c0.n.
                                                              super_Tuple3<pbrt::Normal3,_float>.z *
                                                             (float)local_2d8._24_4_)));
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar20._0_4_)),
                                      ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.x
                                             ),ZEXT416((uint)local_2d8._16_4_));
            auVar20._8_4_ = 0x7fffffff;
            auVar20._0_8_ = 0x7fffffff7fffffff;
            auVar20._12_4_ = 0x7fffffff;
            auVar19 = vandps_avx512vl(auVar19,auVar20);
            fVar23 = auVar19._0_4_;
          }
          else {
            fVar23 = 1.0;
          }
          auVar19._0_4_ = fVar23 * (float)local_1c8 * (float)local_2d8._0_4_;
          auVar19._4_4_ = fVar23 * afStack_1c4[0] * (float)local_2d8._4_4_;
          auVar19._8_4_ = fVar23 * afStack_1c4[1] * (float)local_2d8._8_4_;
          auVar19._12_4_ = fVar23 * afStack_1c4[2] * (float)local_2d8._12_4_;
          fVar23 = FVar22 * (float)local_410._8_4_ * (float)local_2d8._28_4_;
          auVar27._4_4_ = fVar23;
          auVar27._0_4_ = fVar23;
          auVar27._8_4_ = fVar23;
          auVar27._12_4_ = fVar23;
          auVar19 = vdivps_avx(auVar19,auVar27);
          SVar44.values.values[2] = local_430.pdf.values[2];
          SVar44.values.values[3] = local_430.pdf.values[3];
          SVar44.values.values[0] = local_430.pdf.values[0];
          SVar44.values.values[1] = local_430.pdf.values[1];
          auVar20 = vshufpd_avx(auVar19,auVar19,1);
          a.values.values._0_8_ = auVar19._0_8_;
          a.values.values._8_8_ = auVar20._0_8_;
          SVar44 = SafeDiv(a,SVar44);
          local_338._0_8_ =
               *(uintptr_t *)
                (((this_00->
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  ).bits & 0xffffffffffff) + 0x340);
          if ((bool)uStack_210 == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
          }
          FilmHandle::AddSplat
                    ((FilmHandle *)local_338,(Point2f *)(local_2d8 + 0x20),SVar44,&local_430);
        }
      }
    }
  }
LAB_003cccb3:
  if ((bool)uStack_210 == true) {
    uStack_210 = 0;
  }
LAB_003cccc5:
  if (local_360 == false) {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
  }
  local_338._20_4_ = afStack_3f4[8];
  local_338._24_4_ = afStack_3f4[9];
  uVar10 = local_338._20_8_;
  local_338._0_4_ = afStack_3f4[3];
  local_338._4_4_ = afStack_3f4[4];
  local_338._8_4_ = afStack_3f4[5];
  local_338._12_4_ = afStack_3f4[6];
  local_338._32_4_ = afStack_3f4[0xb];
  local_338._36_4_ = afStack_3f4[0xc];
  local_338._40_4_ = local_338._40_4_ & 0xffffff00;
  local_338._44_4_ = 0.0;
  local_338._48_4_ = 0.0;
  local_338._52_4_ = 0.0;
  local_338._56_4_ = 0.0;
  auStack_2ec = (undefined1  [16])0x0;
  fVar23 = 1.0;
  if (local_370 == '\x01') {
    local_338._20_4_ = (undefined4)afStack_3f4._32_8_;
    auVar19 = vfmadd132ss_fma(ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.y),
                              ZEXT416((uint)(local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z *
                                            (float)local_338._20_4_)),ZEXT416((uint)afStack_3f4[7]))
    ;
    auVar20 = vfmsub213ss_fma(ZEXT416((uint)local_338._20_4_),
                              ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z),
                              ZEXT416((uint)(local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z *
                                            (float)local_338._20_4_)));
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar20._0_4_)),
                              ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.x),
                              ZEXT416((uint)afStack_3f4[6]));
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx512vl(auVar19,auVar3);
    fVar23 = auVar19._0_4_;
  }
  auVar25._0_4_ = fVar23 * (float)local_3f8;
  auVar25._4_4_ = fVar23 * afStack_3f4[0];
  auVar25._8_4_ = fVar23 * afStack_3f4[1];
  auVar25._12_4_ = fVar23 * afStack_3f4[2];
  fVar23 = (float)local_410._8_4_ * (float)local_368 * (float)local_364;
  auVar38._4_4_ = fVar23;
  auVar38._0_4_ = fVar23;
  auVar38._8_4_ = fVar23;
  auVar38._12_4_ = fVar23;
  _local_348 = vdivps_avx(auVar25,auVar38);
  this_01 = &(this->super_ImageTileIntegrator).super_Integrator.aggregate;
  iVar18 = 0;
  local_338._20_8_ = uVar10;
  local_338._60_4_ = local_338._44_4_;
  local_338._64_8_ = local_338._48_8_;
  local_338._72_4_ = local_338._56_4_;
  do {
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    if (((this_01->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      _local_2d8 = ZEXT1664(ZEXT816(0) << 0x40);
      local_1d8 = 0;
      unique0x10001d3e = _local_2d8;
      IStack_260._8_64_ = _local_2d8;
      unique0x10001dfe = _local_2d8;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)local_2d8,this_01,(Ray *)local_338,INFINITY);
    }
    bVar15 = 1;
    if (local_1d8._0_1_ != false) {
      local_438.
      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
      .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               )(this_00->
                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                ).bits;
      local_440.bits =
           (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      SurfaceInteraction::GetBSDF
                (&local_68,(SurfaceInteraction *)local_2d8,(RayDifferential *)local_338,&local_430,
                 &local_438,scratchBuffer,(SamplerHandle *)&local_440);
      auVar30 = _local_2d8;
      if (((ulong)local_68.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                  .bits & 0xffffffffffff) == 0) {
        if (local_1d8._0_1_ == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
        }
        SurfaceInteraction::SkipIntersection
                  ((SurfaceInteraction *)local_2d8,(RayDifferential *)local_338,
                   (Float)auStack_20f._47_4_);
        bVar15 = 0;
      }
      else {
        iVar17 = iVar18 + 1;
        bVar15 = 1;
        bVar12 = iVar18 != this->maxDepth;
        iVar18 = iVar17;
        if (bVar12) {
          uVar13 = (sampler->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          pDVar16 = (DebugMLTSampler *)(uVar13 & 0xffffffffffff);
          sVar7 = (short)(uVar13 >> 0x30);
          if (uVar13 < 0x5000000000000) {
            if (uVar13 < 0x3000000000000) {
              if (sVar7 == 2) {
                TVar24 = (Tuple2<pbrt::Point2,_float>)
                         StratifiedSampler::Get2D((StratifiedSampler *)pDVar16);
              }
              else {
                TVar24 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)pDVar16)
                ;
              }
            }
            else if (sVar7 == 3) {
              TVar24 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)pDVar16);
            }
            else {
              TVar24 = (Tuple2<pbrt::Point2,_float>)
                       PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar16);
            }
          }
          else if (uVar13 < 0x7000000000000) {
            if (sVar7 == 6) {
              TVar24 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)pDVar16);
            }
            else {
              TVar24 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)pDVar16);
            }
          }
          else if (uVar13 >> 0x30 == 8) {
            TVar24 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar16);
          }
          else if (sVar7 == 7) {
            TVar24 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar16);
          }
          else {
            local_4b8._0_4_ = DebugMLTSampler::Get1D(pDVar16);
            local_4b8._4_4_ = extraout_XMM0_Db_01;
            fStack_4b0 = (float)extraout_XMM0_Dc_01;
            fStack_4ac = (float)extraout_XMM0_Dd_01;
            auVar33._0_4_ = DebugMLTSampler::Get1D(pDVar16);
            auVar33._4_60_ = extraout_var_01;
            auVar19 = vinsertps_avx(_local_4b8,auVar33._0_16_,0x10);
            TVar24 = auVar19._0_8_;
          }
          CameraHandle::SampleWi
                    ((optional<pbrt::CameraWiSample> *)local_1c8,this_00,(Interaction *)local_2d8,
                     (Point2f)TVar24,&local_430);
          if ((local_100 == true) && ((afStack_1c4[6] != 0.0 || (NAN(afStack_1c4[6]))))) {
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y = afStack_1c4[4];
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x = afStack_1c4[3];
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = afStack_1c4[5];
            auVar43 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            auVar36 = ZEXT856(0);
            SVar44 = BSDF::f(&local_68,(Vector3f)auVar30._28_12_,wiRender,Importance);
            auVar42._0_8_ = SVar44.values.values._8_8_;
            auVar42._8_56_ = auVar43;
            auVar34._0_8_ = SVar44.values.values._0_8_;
            auVar34._8_56_ = auVar36;
            if (local_100 == false) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
            }
            auVar19 = vmovlhps_avx(auVar34._0_16_,auVar42._0_16_);
            auVar20 = vfmadd132ss_fma(ZEXT416((uint)IStack_260.pi.super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),
                                      ZEXT416((uint)(IStack_260.pi.super_Point3<pbrt::Interval>.
                                                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                                                     low * afStack_1c4[5])),
                                      ZEXT416((uint)afStack_1c4[4]));
            auVar27 = vfmsub213ss_fma(ZEXT416((uint)afStack_1c4[5]),
                                      ZEXT416((uint)IStack_260.pi.super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                                             ),ZEXT416((uint)(IStack_260.pi.
                                                              super_Point3<pbrt::Interval>.
                                                                                                                            
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low *
                                                  afStack_1c4[5])));
            auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ + auVar27._0_4_)),
                                      ZEXT416((uint)IStack_260.pi.super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
                                             ),ZEXT416((uint)afStack_1c4[3]));
            uVar37 = auVar20._0_4_;
            auVar39._4_4_ = uVar37;
            auVar39._0_4_ = uVar37;
            auVar39._8_4_ = uVar37;
            auVar39._12_4_ = uVar37;
            auVar4._8_4_ = 0x7fffffff;
            auVar4._0_8_ = 0x7fffffff7fffffff;
            auVar4._12_4_ = 0x7fffffff;
            auVar20 = vandps_avx512vl(auVar39,auVar4);
            auVar26._0_4_ =
                 auVar20._0_4_ * auVar19._0_4_ * (float)local_348._0_4_ * (float)local_1c8;
            auVar26._4_4_ = auVar20._4_4_ * auVar19._4_4_ * (float)local_348._4_4_ * afStack_1c4[0];
            auVar26._8_4_ = auVar20._8_4_ * auVar19._8_4_ * fStack_340 * afStack_1c4[1];
            auVar26._12_4_ = auVar20._12_4_ * auVar19._12_4_ * fStack_33c * afStack_1c4[2];
            auVar5._4_4_ = afStack_1c4[6];
            auVar5._0_4_ = afStack_1c4[6];
            auVar5._8_4_ = afStack_1c4[6];
            auVar5._12_4_ = afStack_1c4[6];
            auVar19 = vdivps_avx512vl(auVar26,auVar5);
            auVar8._8_4_ = local_430.pdf.values[2];
            auVar8._12_4_ = local_430.pdf.values[3];
            auVar8._0_4_ = local_430.pdf.values[0];
            auVar8._4_4_ = local_430.pdf.values[1];
            uVar13 = vcmpps_avx512vl(auVar8,_DAT_00453010,4);
            auVar19 = vdivps_avx512vl(auVar19,auVar8);
            fVar1 = (float)((uint)((byte)uVar13 & 1) * auVar19._0_4_);
            fVar23 = (float)((uint)((byte)(uVar13 >> 1) & 1) * auVar19._4_4_);
            local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
                 (float)((uint)((byte)(uVar13 >> 2) & 1) * auVar19._8_4_);
            auVar21._8_4_ = local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar21._0_8_ = CONCAT44(fVar23,fVar1);
            local_c8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)((uint)((byte)(uVar13 >> 3) & 1) * auVar19._12_4_);
            auVar21._12_4_ = local_c8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
            local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = fVar23;
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              uVar13 = 0;
              while (uVar14 = uVar13, uVar14 != 3) {
                fVar2 = (&local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y)[uVar14];
                if ((fVar2 != 0.0) || (uVar13 = uVar14 + 1, NAN(fVar2))) break;
              }
              if (2 < uVar14) goto LAB_003cd201;
            }
            local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = fVar1;
            bVar12 = Integrator::Unoccluded((Integrator *)this,&local_1a0,&local_150);
            if (bVar12) {
              local_478._0_8_ =
                   *(undefined8 *)
                    (((this_00->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits & 0xffffffffffff) + 0x340);
              if (local_100 == false) {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
              }
              auVar19 = vshufpd_avx(auVar21,auVar21,1);
              v.values.values._8_8_ = auVar19._0_8_;
              v.values.values[0] = fVar1;
              v.values.values[1] = fVar23;
              FilmHandle::AddSplat((FilmHandle *)&local_478.__align,&local_1a8,v,&local_430);
            }
          }
LAB_003cd201:
          uVar13 = (sampler->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar13;
          local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)(uVar13 >> 0x20);
          FVar22 = DispatchSplit<9>::operator()
                             ((DispatchSplit<9> *)&local_478,&local_c8,uVar13 >> 0x30);
          uVar13 = (sampler->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          pDVar16 = (DebugMLTSampler *)(uVar13 & 0xffffffffffff);
          sVar7 = (short)(uVar13 >> 0x30);
          if (uVar13 < 0x5000000000000) {
            if (uVar13 < 0x3000000000000) {
              if (sVar7 == 2) {
                TVar24 = (Tuple2<pbrt::Point2,_float>)
                         StratifiedSampler::Get2D((StratifiedSampler *)pDVar16);
              }
              else {
                TVar24 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)pDVar16)
                ;
              }
            }
            else if (sVar7 == 3) {
              TVar24 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)pDVar16);
            }
            else {
              TVar24 = (Tuple2<pbrt::Point2,_float>)
                       PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar16);
            }
          }
          else if (uVar13 < 0x7000000000000) {
            if (sVar7 == 6) {
              TVar24 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)pDVar16);
            }
            else {
              TVar24 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)pDVar16);
            }
          }
          else if (uVar13 >> 0x30 == 8) {
            TVar24 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar16);
          }
          else if (sVar7 == 7) {
            TVar24 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar16);
          }
          else {
            local_358 = DebugMLTSampler::Get1D(pDVar16);
            uStack_354 = extraout_XMM0_Db_02;
            uStack_350 = extraout_XMM0_Dc_02;
            uStack_34c = extraout_XMM0_Dd_02;
            auVar35._0_4_ = DebugMLTSampler::Get1D(pDVar16);
            auVar35._4_60_ = extraout_var_02;
            auVar9._4_4_ = uStack_354;
            auVar9._0_4_ = local_358;
            auVar9._8_4_ = uStack_350;
            auVar9._12_4_ = uStack_34c;
            auVar19 = vinsertps_avx(auVar9,auVar35._0_16_,0x10);
            TVar24 = auVar19._0_8_;
          }
          BSDF::Sample_f((optional<pbrt::BSDFSample> *)&local_478.__align,&local_68,
                         (Vector3f)auVar30._28_12_,FVar22,(Point2f)TVar24,Importance,All);
          bVar15 = local_44c;
          uVar11 = local_478._8_8_;
          uVar10 = local_478._0_8_;
          if (local_44c != 0) {
            FVar22 = IStack_260.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            local_480 = (uint)IStack_260.pi.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            auVar27 = ZEXT416((uint)local_478._16_4_);
            local_47c = local_478._20_4_;
            local_484 = IStack_260.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            local_358 = (Float)local_478._28_4_;
            wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_478._20_4_;
            wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_478._16_4_;
            local_488 = (float)local_478._24_4_;
            wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_478._24_4_;
            SurfaceInteraction::SpawnRay
                      (&local_c8,(SurfaceInteraction *)local_2d8,(RayDifferential *)local_338,
                       &local_68,wi,local_478._32_4_,(Float)local_478._36_4_);
            auVar19 = vfmadd132ss_fma(ZEXT416(local_47c),ZEXT416((uint)(local_484 * local_488)),
                                      ZEXT416(local_480));
            auVar20 = vfmsub213ss_fma(ZEXT416((uint)local_488),ZEXT416((uint)local_484),
                                      ZEXT416((uint)(local_484 * local_488)));
            auVar19 = vfmadd132ss_fma(auVar27,ZEXT416((uint)(auVar19._0_4_ + auVar20._0_4_)),
                                      ZEXT416((uint)FVar22));
            uVar37 = auVar19._0_4_;
            auVar28._4_4_ = uVar37;
            auVar28._0_4_ = uVar37;
            auVar28._8_4_ = uVar37;
            auVar28._12_4_ = uVar37;
            auVar6._8_4_ = 0x7fffffff;
            auVar6._0_8_ = 0x7fffffff7fffffff;
            auVar6._12_4_ = 0x7fffffff;
            auVar19 = vandps_avx512vl(auVar28,auVar6);
            local_4b8._0_4_ = (undefined4)uVar10;
            local_4b8._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
            fStack_4b0 = (float)uVar11;
            fStack_4ac = (float)((ulong)uVar11 >> 0x20);
            auVar29._0_4_ = auVar19._0_4_ * (float)local_4b8._0_4_;
            auVar29._4_4_ = auVar19._4_4_ * (float)local_4b8._4_4_;
            auVar29._8_4_ = auVar19._8_4_ * fStack_4b0;
            auVar29._12_4_ = auVar19._12_4_ * fStack_4ac;
            auVar40._4_4_ = local_358;
            auVar40._0_4_ = local_358;
            auVar40._8_4_ = local_358;
            auVar40._12_4_ = local_358;
            auVar19 = vdivps_avx(auVar29,auVar40);
            local_348._4_4_ = auVar19._4_4_ * (float)local_348._4_4_;
            local_348._0_4_ = auVar19._0_4_ * (float)local_348._0_4_;
            fStack_340 = auVar19._8_4_ * fStack_340;
            fStack_33c = auVar19._12_4_ * fStack_33c;
            local_338._4_4_ = local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
            local_338._0_4_ = local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
            local_338._20_4_ = local_c8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
            local_338._24_4_ = local_c8.super_Ray.time;
            local_338._8_4_ = local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
            local_338._12_4_ = local_c8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
            local_338._32_8_ =
                 local_c8.super_Ray.medium.
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 .bits;
            local_338._72_4_ = local_c8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y;
            auStack_2ec = local_c8._76_16_;
            local_338._40_4_ = local_c8._40_4_;
            local_338._44_4_ = local_c8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
            local_338._48_4_ = local_c8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
            local_338._52_4_ = local_c8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
            local_338._56_4_ = local_c8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
            local_338._60_4_ = local_c8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
            local_338._64_4_ = local_c8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
            local_338._68_4_ = local_c8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x;
          }
          if (local_44c == 1) {
            local_44c = 0;
          }
          if (local_100 == true) {
            local_100 = false;
          }
          bVar15 = bVar15 ^ 1;
        }
      }
    }
    if (local_1d8._0_1_ == true) {
      local_1d8 = local_1d8 & 0xffffffffffffff00;
    }
    if (bVar15 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void LightPathIntegrator::EvaluatePixelSample(Point2i pPixel, int sampleIndex,
                                              SamplerHandle sampler,
                                              ScratchBuffer &scratchBuffer) {
    // Sample wavelengths for the ray
    Float lu = sampler.Get1D();
    if (Options->disableWavelengthJitter)
        lu = 0.5;
    SampledWavelengths lambda = camera.GetFilm().SampleWavelengths(lu);

    // Sample light to start light path
    pstd::optional<SampledLight> sampledLight = lightSampler->Sample(sampler.Get1D());
    if (!sampledLight)
        return;
    LightHandle light = sampledLight->light;
    Float lightPDF = sampledLight->pdf;

    // Sample point on light source for light path
    Float time = camera.SampleTime(sampler.Get1D());
    Point2f ul0 = sampler.Get2D();
    Point2f ul1 = sampler.Get2D();
    pstd::optional<LightLeSample> les = light.SampleLe(ul0, ul1, lambda, time);
    if (!les || les->pdfPos == 0 || les->pdfDir == 0 || !les->L)
        return;

    // Add contribution of directly-visible light source
    if (les->intr) {
        pstd::optional<CameraWiSample> cs =
            camera.SampleWi(*les->intr, sampler.Get2D(), lambda);
        if (cs && cs->pdf != 0) {
            if (Float pdf = light.PDF_Li(cs->pLens, cs->wi); pdf > 0) {
                // Add light's emitted radiance if non-zero and light is visible
                SampledSpectrum Le =
                    light.L(les->intr->p(), les->intr->n, les->intr->uv, cs->wi, lambda);
                if (Le && Unoccluded(cs->pRef, cs->pLens)) {
                    // Compute visible light's path contribution and add to film
                    SampledSpectrum L = Le * les->AbsCosTheta(cs->wi) * cs->Wi /
                                        (lightPDF * pdf * cs->pdf);
                    L = SafeDiv(L, lambda.PDF());
                    camera.GetFilm().AddSplat(cs->pRaster, L, lambda);
                }
            }
        }
    }

    // Follow light path and accumulate contributions to image
    int depth = 0;
    // Initialize light path ray and weighted path throughput _beta_
    RayDifferential ray(les->ray);
    SampledSpectrum beta =
        les->L * les->AbsCosTheta(ray.d) / (lightPDF * les->pdfPos * les->pdfDir);

    while (true) {
        // Intersect light path ray with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (!si)
            break;
        SurfaceInteraction &isect = si->intr;

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Splat contribution into film if intersection point is visible to camera
        Vector3f wo = isect.wo;
        pstd::optional<CameraWiSample> cs =
            camera.SampleWi(isect, sampler.Get2D(), lambda);
        if (cs && cs->pdf != 0) {
            SampledSpectrum L = beta * bsdf.f(wo, cs->wi, TransportMode::Importance) *
                                AbsDot(cs->wi, isect.shading.n) * cs->Wi / cs->pdf;
            L = SafeDiv(L, lambda.PDF());
            if (L && Unoccluded(cs->pRef, cs->pLens))
                camera.GetFilm().AddSplat(cs->pRaster, L, lambda);
        }

        // Sample BSDF and update light path state
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs =
            bsdf.Sample_f(wo, u, sampler.Get2D(), TransportMode::Importance);
        if (!bs)
            break;
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);
    }
}